

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::draw(CGUITabControl *this)

{
  undefined1 *other;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  IGUIButton *pIVar2;
  int iVar3;
  IGUITab *pIVar4;
  long *plVar5;
  char cVar6;
  undefined4 uVar7;
  int iVar8;
  undefined4 uVar9;
  long *plVar10;
  long *plVar11;
  pointer ppIVar12;
  wchar_t *pwVar13;
  undefined8 *puVar14;
  undefined8 uVar15;
  long lVar16;
  rect<int> *prVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  rect<int> frameRect;
  rect<int> tr;
  rect<int> textClipRect;
  rect<int> *in_stack_ffffffffffffff18;
  uint *puVar22;
  uint local_d8;
  int iStack_d4;
  uint uStack_d0;
  int iStack_cc;
  ulong local_c0;
  ulong local_b8;
  IGUITab *local_b0;
  long *local_a8;
  ulong local_a0;
  long *local_98;
  rect<int> *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_78;
  long *local_70;
  string<wchar_t> local_68;
  rect<int> local_48;
  
  if ((this->field_0xa0 == '\x01') &&
     (plVar10 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))(),
     plVar10 != (long *)0x0)) {
    plVar11 = (long *)(**(code **)(*plVar10 + 0x30))(plVar10,0);
    local_98 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
    local_d8 = *(uint *)&this->field_0x40;
    iStack_d4 = *(int *)&this->field_0x44;
    uStack_d0 = *(uint *)&this->field_0x48;
    iStack_cc = *(int *)&this->field_0x4c;
    if ((this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->Tabs).m_data.
        super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar7 = (**(code **)*plVar10)(plVar10,3);
      (**(code **)(*local_98 + 0x198))(local_98,uVar7,&local_d8,&this->field_0x50);
    }
    uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (plVar11 != (long *)0x0) {
      if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
        iStack_d4 = iStack_d4 + 2;
        iStack_cc = iStack_d4 + this->TabHeight;
      }
      else {
        iStack_d4 = ~this->TabHeight + iStack_cc;
        iStack_cc = iStack_cc + -2;
      }
      local_88 = 0;
      uStack_80 = 0;
      uVar19 = (ulong)(uint)this->CurrentScrollTabIndex;
      ppIVar12 = (this->Tabs).m_data.
                 super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_78 = uVar19;
      local_70 = plVar10;
      if ((uint)this->CurrentScrollTabIndex <
          (uint)((ulong)((long)(this->Tabs).m_data.
                               super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar12) >> 3)) {
        local_90 = (rect<int> *)&this->field_0x50;
        local_a0 = 0;
        local_b8 = 0;
        local_c0 = 0;
        local_b0 = (IGUITab *)0x0;
        uVar18 = local_d8 + 2;
        local_a8 = plVar11;
        do {
          if (ppIVar12[uVar19] == (IGUITab *)0x0) {
            pwVar13 = (wchar_t *)0x0;
          }
          else {
            pwVar13 = (wchar_t *)
                      (**(code **)(*(long *)&(ppIVar12[uVar19]->super_IGUIElement).
                                             super_IEventReceiver + 0xa8))();
          }
          iVar8 = (**(code **)(*plVar11 + 8))(plVar11,pwVar13);
          prVar17 = local_90;
          iVar8 = iVar8 + this->TabExtraWidth;
          iVar20 = this->TabMaxWidth;
          iVar3 = iVar20;
          if (iVar8 < iVar20) {
            iVar3 = iVar8;
          }
          if (iVar20 < 1) {
            iVar3 = iVar8;
          }
          iVar20 = iVar3;
          if (this->ScrollControl == true) {
            iVar8 = ((this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X - uVar18) +
                    -2;
            if (iVar8 < iVar3) {
              iVar20 = iVar8;
            }
            local_a0 = local_a0 & 0xff;
            if (iVar8 < iVar3) {
              local_a0 = 1;
            }
          }
          uVar21 = iVar20 + uVar18;
          local_d8 = uVar18;
          uStack_d0 = uVar21;
          if (uVar19 == (uint)this->ActiveTabIndex) {
            local_b0 = (this->Tabs).m_data.
                       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19];
            local_c0 = (ulong)uVar21;
            local_b8 = (ulong)uVar18;
            plVar11 = local_a8;
          }
          else {
            (**(code **)(*local_70 + 0x90))
                      (local_70,this,0,&local_d8,local_90,this->VerticalAlignment);
            local_48.UpperLeftCorner.Y = iStack_d4;
            local_48.UpperLeftCorner.X = local_d8;
            local_48.LowerRightCorner.Y = iStack_cc;
            local_48.LowerRightCorner.X = uStack_d0;
            in_stack_ffffffffffffff18 = &local_48;
            core::rect<int>::clipAgainst(in_stack_ffffffffffffff18,prVar17);
            local_68.str._M_dataplus._M_p = (pointer)&local_68.str.field_2;
            local_68.str._M_string_length = 0;
            local_68.str.field_2._M_local_buf[0] = L'\0';
            core::string<wchar_t>::operator=(&local_68,pwVar13);
            uVar7 = (**(code **)(*(long *)&((this->Tabs).m_data.
                                            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar19]->
                                           super_IGUIElement).super_IEventReceiver + 0x148))();
            plVar11 = local_a8;
            (**(code **)*local_a8)(local_a8,&local_68,&local_d8,uVar7,1,1,in_stack_ffffffffffffff18)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_68.str._M_dataplus._M_p != &local_68.str.field_2) {
              operator_delete(local_68.str._M_dataplus._M_p,
                              CONCAT44(local_68.str.field_2._M_local_buf[1],
                                       local_68.str.field_2._M_local_buf[0]) * 4 + 4);
            }
          }
          uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          uVar19 = uVar19 + 1;
          ppIVar12 = (this->Tabs).m_data.
                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        } while ((uVar19 < ((ulong)((long)(this->Tabs).m_data.
                                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppIVar12) >> 3 & 0xffffffff)) &&
                (uVar18 = uVar21, (local_a0 & 1) == 0));
      }
      else {
        local_b0 = (IGUITab *)0x0;
        local_c0 = 0;
        local_b8 = 0;
        local_a0 = 0;
      }
      plVar5 = local_70;
      plVar10 = (long *)&this->field_0x40;
      if (((int)local_b8 == 0) || (((int)local_c0 == 0 || (local_b0 == (IGUITab *)0x0)))) {
        local_88 = CONCAT44(iStack_cc + -1,*(undefined4 *)&this->field_0x40);
        uStack_80 = CONCAT44(iStack_cc,*(undefined4 *)&this->field_0x48);
        iVar20 = (int)local_78;
        if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
          uVar9 = (**(code **)*local_70)(local_70,3);
          lVar16 = *local_98;
        }
        else {
          local_88 = CONCAT44(iStack_d4 + -1,*(undefined4 *)&this->field_0x40);
          uStack_80 = CONCAT44(iStack_d4,*(undefined4 *)&this->field_0x48);
          uVar9 = (**(code **)*local_70)(local_70,0);
          lVar16 = *local_98;
        }
        (**(code **)(lVar16 + 0x198))(local_98,uVar9,&local_88,&this->field_0x50);
      }
      else {
        local_d8 = (int)local_b8 - 2;
        uStack_d0 = (int)local_c0 + 2;
        other = &this->field_0x50;
        local_a8 = plVar10;
        local_90 = (rect<int> *)other;
        if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
          iStack_d4 = iStack_d4 + -2;
          (**(code **)(*local_70 + 0x90))(local_70,this,1,&local_d8,other);
          local_48.UpperLeftCorner.Y = iStack_d4;
          local_48.UpperLeftCorner.X = local_d8;
          local_48.LowerRightCorner.Y = iStack_cc;
          local_48.LowerRightCorner.X = uStack_d0;
          core::rect<int>::clipAgainst(&local_48,(rect<int> *)other);
          pIVar4 = local_b0;
          pwVar13 = (wchar_t *)
                    (**(code **)(*(long *)&(local_b0->super_IGUIElement).super_IEventReceiver + 0xa8
                                ))(local_b0);
          paVar1 = &local_68.str.field_2;
          local_68.str._M_string_length = 0;
          local_68.str.field_2._M_local_buf[0] = L'\0';
          local_68.str._M_dataplus._M_p = (pointer)paVar1;
          core::string<wchar_t>::operator=(&local_68,pwVar13);
          uVar7 = (**(code **)(*(long *)&(pIVar4->super_IGUIElement).super_IEventReceiver + 0x148))
                            (pIVar4);
          prVar17 = &local_48;
          (**(code **)*plVar11)(plVar11,&local_68,&local_d8,uVar7,1,1,prVar17);
          uVar7 = (undefined4)((ulong)prVar17 >> 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_68.str._M_dataplus._M_p != paVar1) {
            operator_delete(local_68.str._M_dataplus._M_p,
                            CONCAT44(local_68.str.field_2._M_local_buf[1],
                                     local_68.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          local_88._0_4_ = *(undefined4 *)&this->field_0x40;
          uStack_80._0_4_ = (int)local_b8 + -1;
          local_88._4_4_ = iStack_cc + -1;
          uStack_80._4_4_ = iStack_cc;
          uVar9 = (**(code **)*plVar5)(plVar5,3);
          prVar17 = local_90;
          plVar10 = local_98;
          (**(code **)(*local_98 + 0x198))(local_98,uVar9,&local_88,local_90);
          local_88 = CONCAT44(local_88._4_4_,(int)local_c0);
          uStack_80 = CONCAT44(uStack_80._4_4_,*(undefined4 *)&this->field_0x48);
          puVar14 = (undefined8 *)*plVar5;
          uVar15 = 3;
        }
        else {
          iStack_cc = iStack_cc + 2;
          (**(code **)(*local_70 + 0x90))(local_70,this,1,&local_d8,other);
          pIVar4 = local_b0;
          pwVar13 = (wchar_t *)
                    (**(code **)(*(long *)&(local_b0->super_IGUIElement).super_IEventReceiver + 0xa8
                                ))(local_b0);
          paVar1 = &local_68.str.field_2;
          local_68.str._M_string_length = 0;
          local_68.str.field_2._M_local_buf[0] = L'\0';
          local_68.str._M_dataplus._M_p = (pointer)paVar1;
          core::string<wchar_t>::operator=(&local_68,pwVar13);
          uVar7 = (**(code **)(*(long *)&(pIVar4->super_IGUIElement).super_IEventReceiver + 0x148))
                            (pIVar4);
          puVar22 = &local_d8;
          (**(code **)*plVar11)(plVar11,&local_68,puVar22,uVar7,1,1,puVar22);
          uVar7 = (undefined4)((ulong)puVar22 >> 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_68.str._M_dataplus._M_p != paVar1) {
            operator_delete(local_68.str._M_dataplus._M_p,
                            CONCAT44(local_68.str.field_2._M_local_buf[1],
                                     local_68.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          local_88._0_4_ = *(undefined4 *)&this->field_0x40;
          uStack_80._0_4_ = (int)local_b8 + -1;
          local_88._4_4_ = iStack_d4 + -1;
          uStack_80._4_4_ = iStack_d4;
          uVar9 = (**(code **)*plVar5)(plVar5,0);
          prVar17 = local_90;
          plVar10 = local_98;
          (**(code **)(*local_98 + 0x198))(local_98,uVar9,&local_88,local_90);
          local_88 = CONCAT44(local_88._4_4_,(int)local_c0);
          uStack_80 = CONCAT44(uStack_80._4_4_,*(undefined4 *)&this->field_0x48);
          puVar14 = (undefined8 *)*plVar5;
          uVar15 = 0;
        }
        uVar9 = (*(code *)*puVar14)(plVar5,uVar15);
        (**(code **)(*plVar10 + 0x198))(plVar10,uVar9,&local_88,prVar17);
        iVar20 = (int)local_78;
        plVar10 = local_a8;
      }
      (**(code **)(*plVar5 + 0x98))
                (plVar5,this,this->Border,this->FillBackground,plVar10,&this->field_0x50,
                 CONCAT44(uVar7,this->TabHeight),this->VerticalAlignment);
      pIVar2 = this->UpButton;
      if (pIVar2 != (IGUIButton *)0x0) {
        (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
                  (pIVar2,(ulong)(0 < iVar20));
      }
      pIVar2 = this->DownButton;
      if (pIVar2 != (IGUIButton *)0x0) {
        (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
                  (pIVar2,(ulong)((byte)local_a0 & 1));
      }
      refreshSprites(this);
      cVar6 = (**(code **)(*(long *)this + 0x68))(this);
      if (cVar6 != '\0') {
        for (puVar14 = *(undefined8 **)&this->field_0x8; puVar14 != (undefined8 *)&this->field_0x8;
            puVar14 = (undefined8 *)*puVar14) {
          (**(code **)(*(long *)puVar14[2] + 0x50))();
        }
      }
    }
  }
  return;
}

Assistant:

void CGUITabControl::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return;

	IGUIFont *font = skin->getFont();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	core::rect<s32> frameRect(AbsoluteRect);

	// some empty background as placeholder when there are no tabs
	if (Tabs.empty())
		driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), frameRect, &AbsoluteClippingRect);

	if (!font)
		return;

	// tab button bar can be above or below the tabs
	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight - 1;
		frameRect.LowerRightCorner.Y -= 2;
	}

	core::rect<s32> tr;
	s32 pos = frameRect.UpperLeftCorner.X + 2;

	bool needLeftScroll = CurrentScrollTabIndex > 0;
	bool needRightScroll = false;

	// left and right pos of the active tab
	s32 left = 0;
	s32 right = 0;

	// const wchar_t* activetext = 0;
	IGUITab *activeTab = 0;

	// Draw all tab-buttons except the active one
	for (u32 i = CurrentScrollTabIndex; i < Tabs.size() && !needRightScroll; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				needRightScroll = true;
				len = space;
			}
		}

		frameRect.LowerRightCorner.X += len;
		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if ((s32)i == ActiveTabIndex) {
			// for active button just remember values
			left = frameRect.UpperLeftCorner.X;
			right = frameRect.LowerRightCorner.X;
			// activetext = text;
			activeTab = Tabs[i];
		} else {
			skin->draw3DTabButton(this, false, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(text, frameRect, Tabs[i]->getTextColor(),
					true, true, &textClipRect);
		}
	}

	// Draw active tab button
	// Drawn later than other buttons because it draw over the buttons before/after it.
	if (left != 0 && right != 0 && activeTab != 0) {
		// draw upper highlight frame
		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.UpperLeftCorner.Y -= 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &textClipRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.LowerRightCorner.Y += 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &frameRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	} else {
		// No active tab
		// Draw a line separating button bar from tab area
		tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
		tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
		tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
		tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;

		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	}

	// drawing some border and background for the tab-area.
	skin->draw3DTabBody(this, Border, FillBackground, AbsoluteRect, &AbsoluteClippingRect, TabHeight, VerticalAlignment);

	// enable scrollcontrols on need
	if (UpButton)
		UpButton->setEnabled(needLeftScroll);
	if (DownButton)
		DownButton->setEnabled(needRightScroll);
	refreshSprites();

	IGUIElement::draw();
}